

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::QStatusBar(QStatusBar *this,QWidget *parent)

{
  long lVar1;
  QStatusBarPrivate *this_00;
  
  this_00 = (QStatusBarPrivate *)operator_new(0x2a8);
  QStatusBarPrivate::QStatusBarPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d5678;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QStatusBar_007d5828;
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(undefined8 *)(lVar1 + 0x298) = 0;
  *(undefined8 *)(lVar1 + 0x288) = 0;
  *(undefined8 *)(lVar1 + 0x290) = 0;
  setSizeGripEnabled(this,true);
  return;
}

Assistant:

QStatusBar::QStatusBar(QWidget * parent)
    : QWidget(*new QStatusBarPrivate, parent, { })
{
    Q_D(QStatusBar);
    d->box = nullptr;
    d->timer = nullptr;

#if QT_CONFIG(sizegrip)
    d->resizer = nullptr;
    setSizeGripEnabled(true); // causes reformat()
#else
    reformat();
#endif
}